

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::averageDownCoeffsSameAmrLevel
          (MLEBABecLap *this,int amrlev,Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a
          ,Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           *b,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *b_eb)

{
  Long LVar1;
  IntVect *pIVar2;
  MultiFab **ppMVar3;
  int in_ESI;
  long in_RDI;
  IntVect ratio;
  int mglev;
  int nmglevs;
  int in_stack_000004ac;
  IntVect *in_stack_000004b0;
  MultiFab *in_stack_000004b8;
  MultiFab *in_stack_000004c0;
  IntVect *in_stack_00000798;
  int in_stack_000007a0;
  int in_stack_000007a4;
  MultiFab *in_stack_000007a8;
  MultiFab *in_stack_000007b0;
  int in_stack_000008b4;
  IntVect *in_stack_000008b8;
  Array<MultiFab_*,_3> *in_stack_000008c0;
  Array<const_MultiFab_*,_3> *in_stack_000008c8;
  MultiFab *in_stack_ffffffffffffff78;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff80;
  IntVect local_3c;
  int local_30;
  int local_2c;
  int local_c;
  
  local_c = in_ESI;
  LVar1 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                    ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x14e3a19);
  local_2c = (int)LVar1;
  for (local_30 = 1; local_30 < local_2c; local_30 = local_30 + 1) {
    if (local_c < 1) {
      pIVar2 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      local_3c.vect._0_8_ = *(undefined8 *)pIVar2->vect;
      local_3c.vect[2] = pIVar2->vect[2];
    }
    else {
      IntVect::IntVect(&local_3c,2);
    }
    if ((*(double *)(in_RDI + 0x330) != 0.0) || (NAN(*(double *)(in_RDI + 0x330)))) {
      in_stack_ffffffffffffff80 =
           &Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                      ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78)->
            super_FabArray<amrex::FArrayBox>;
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      EB_average_down(in_stack_000007b0,in_stack_000007a8,in_stack_000007a4,in_stack_000007a0,
                      in_stack_00000798);
    }
    else {
      Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffff80,(value_type)in_stack_ffffffffffffff78);
    }
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    GetArrOfConstPtrs<amrex::MultiFab>((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffff80);
    Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
              ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffff80);
    EB_average_down_faces(in_stack_000008c8,in_stack_000008c0,in_stack_000008b8,in_stack_000008b4);
    ppMVar3 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    if (*ppMVar3 != (MultiFab *)0x0) {
      ppMVar3 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff78 = *ppMVar3;
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      EB_average_down_boundaries
                (in_stack_000004c0,in_stack_000004b8,in_stack_000004b0,in_stack_000004ac);
    }
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                            Vector<Array<MultiFab,AMREX_SPACEDIM> >& b,
                                            const Vector<MultiFab*>& b_eb)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::EB_average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        amrex::EB_average_down_faces(amrex::GetArrOfConstPtrs(b[mglev-1]),
                                     amrex::GetArrOfPtrs(b[mglev]),
                                     ratio, 0);

        if (b_eb[mglev])
        {
            amrex::EB_average_down_boundaries(*b_eb[mglev-1], *b_eb[mglev],
                                              ratio, 0);
        }
    }
}